

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int __thiscall
embree::Points::verify
          (Points *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  BufferView<embree::Vec3fx> *pBVar1;
  size_t sVar2;
  iterator __begin1;
  BufferView<embree::Vec3fx> *pBVar3;
  float *pfVar4;
  long lVar5;
  
  sVar2 = (this->vertices).size_active;
  if (sVar2 != 0) {
    pBVar3 = (this->vertices).items;
    pBVar1 = pBVar3 + sVar2;
    lVar5 = 0;
    do {
      if (*(size_t *)((long)&(pBVar3->super_RawBufferView).num + lVar5) !=
          (pBVar3->super_RawBufferView).num) {
        return 0;
      }
      lVar5 = lVar5 + 0x38;
    } while (sVar2 * 0x38 - lVar5 != 0);
    sVar2 = (this->normals).size_active;
    if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
      if (sVar2 != 0) {
        lVar5 = 0;
        do {
          if ((pBVar3->super_RawBufferView).num !=
              *(size_t *)((long)&(((this->normals).items)->super_RawBufferView).num + lVar5)) {
            return 0;
          }
          lVar5 = lVar5 + 0x38;
        } while (sVar2 * 0x38 - lVar5 != 0);
LAB_009ede99:
        do {
          sVar2 = (pBVar3->super_RawBufferView).num;
          if (sVar2 != 0) {
            pfVar4 = (float *)((pBVar3->super_RawBufferView).ptr_ofs + 0xc);
            do {
              if (1.844e+18 <= ABS(pfVar4[-3])) {
                return 0;
              }
              if (1.844e+18 <= ABS(pfVar4[-2])) {
                return 0;
              }
              if (1.844e+18 <= ABS(pfVar4[-1])) {
                return 0;
              }
              if (1.844e+18 <= ABS(*pfVar4)) {
                return 0;
              }
              pfVar4 = (float *)((long)pfVar4 + (pBVar3->super_RawBufferView).stride);
              sVar2 = sVar2 - 1;
            } while (sVar2 != 0);
          }
          pBVar3 = pBVar3 + 1;
          if (pBVar3 == pBVar1) {
            return (int)CONCAT71((int7)(sVar2 >> 8),1);
          }
        } while( true );
      }
    }
    else if (sVar2 == 0) goto LAB_009ede99;
  }
  return 0;
}

Assistant:

__forceinline size_t size     () const { return size_active; }